

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecsMajor.hpp
# Opt level: O2

string * __thiscall
sciplot::TicsSpecsMajor::repr_abi_cxx11_(string *__return_storage_ptr__,TicsSpecsMajor *this)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  runtime_error *this_00;
  string sStack_208;
  string baserepr;
  string local_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::string::string((string *)&local_1c8,(string *)&this->m_axis);
  TicsSpecsBaseOf<sciplot::TicsSpecsMajor>::repr
            (&baserepr,&this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if ((this->super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>).
      super_ShowSpecsOf<sciplot::TicsSpecsMajor>.m_show == false) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&baserepr);
  }
  else {
    sVar1 = (this->m_start)._M_string_length;
    sVar2 = (this->m_increment)._M_string_length;
    if (sVar2 == 0 && sVar1 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "You have called method TicsSpecsMajor::start but not TicsSpecsMajor::increment.");
      goto LAB_001543bc;
    }
    if ((this->m_end)._M_string_length != 0) {
      if (sVar2 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "You have called method TicsSpecsMajor::end but not TicsSpecsMajor::increment.");
LAB_001543bc:
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (sVar1 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "You have called method TicsSpecsMajor::end but not TicsSpecsMajor::start.");
        goto LAB_001543bc;
      }
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_198,(string *)&baserepr);
    std::operator<<(poVar3," ");
    poVar3 = std::operator<<(local_198,(string *)&this->m_at);
    std::operator<<(poVar3," ");
    poVar3 = std::operator<<(local_198,(string *)&this->m_add);
    std::operator<<(poVar3," ");
    poVar3 = std::operator<<(local_198,(string *)&this->m_logscale);
    std::operator<<(poVar3," ");
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&sStack_208);
    std::__cxx11::string::~string((string *)&sStack_208);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__cxx11::string::~string((string *)&baserepr);
  return __return_storage_ptr__;
}

Assistant:

inline auto TicsSpecsMajor::repr() const -> std::string
{
    const auto baserepr = TicsSpecsBaseOf<TicsSpecsMajor>::repr(m_axis);

    if(isHidden())
        return baserepr;

    if(m_start.size() && m_increment.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::start but not TicsSpecsMajor::increment.");
    if(m_end.size() && m_increment.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::end but not TicsSpecsMajor::increment.");
    if(m_end.size() && m_start.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::end but not TicsSpecsMajor::start.");

    std::stringstream ss;
    ss << baserepr << " ";
    ss << m_at << " ";
    ss << m_add << " ";
    ss << m_logscale << " ";
    return internal::removeExtraWhitespaces(ss.str());
}